

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STP_BV.cpp
# Opt level: O0

void __thiscall sch::STP_BV::updateFastPatches(STP_BV *this)

{
  undefined1 auVar1 [16];
  size_type sVar2;
  ulong uVar3;
  STP_Feature **ppSVar4;
  reference ppSVar5;
  ulong local_18;
  size_t i;
  STP_BV *this_local;
  
  if ((this->m_fastPatches != (STP_Feature **)0x0) && (this->m_fastPatches != (STP_Feature **)0x0))
  {
    operator_delete__(this->m_fastPatches);
  }
  sVar2 = std::vector<sch::STP_Feature_*,_std::allocator<sch::STP_Feature_*>_>::size
                    (&this->m_patches);
  if (sVar2 == 0) {
    this->m_patchesSize = 0;
    this->m_fastPatches = (STP_Feature **)0x0;
    this->m_lastPatches = (STP_Feature **)0x0;
  }
  else {
    sVar2 = std::vector<sch::STP_Feature_*,_std::allocator<sch::STP_Feature_*>_>::size
                      (&this->m_patches);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    ppSVar4 = (STP_Feature **)operator_new__(uVar3);
    this->m_fastPatches = ppSVar4;
    for (local_18 = 0;
        sVar2 = std::vector<sch::STP_Feature_*,_std::allocator<sch::STP_Feature_*>_>::size
                          (&this->m_patches), local_18 < sVar2; local_18 = local_18 + 1) {
      ppSVar5 = std::vector<sch::STP_Feature_*,_std::allocator<sch::STP_Feature_*>_>::operator[]
                          (&this->m_patches,local_18);
      this->m_fastPatches[local_18] = *ppSVar5;
    }
    ppSVar4 = this->m_fastPatches;
    sVar2 = std::vector<sch::STP_Feature_*,_std::allocator<sch::STP_Feature_*>_>::size
                      (&this->m_patches);
    this->m_lastPatches = ppSVar4 + sVar2;
    sVar2 = std::vector<sch::STP_Feature_*,_std::allocator<sch::STP_Feature_*>_>::size
                      (&this->m_patches);
    this->m_patchesSize = (int)sVar2;
  }
  return;
}

Assistant:

void STP_BV::updateFastPatches()
{
  if(m_fastPatches != NULL)
  {
    delete[] m_fastPatches;
  }

  if(m_patches.size() > 0)
  {
    m_fastPatches = new STP_Feature *[m_patches.size()];
    for(size_t i = 0; i < m_patches.size(); i++)
    {
      m_fastPatches[i] = m_patches[i];
    }

    m_lastPatches = &m_fastPatches[m_patches.size()];
    m_patchesSize = static_cast<int>(m_patches.size());
  }
  else
  {
    m_patchesSize = 0;
    m_lastPatches = m_fastPatches = NULL;
  }
}